

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

void __thiscall
google::protobuf::File::WriteStringToFileOrDie(File *this,string_view contents,string *name)

{
  int iVar1;
  FILE *__s;
  File *v1;
  Nonnull<const_char_*> failure_msg;
  LogMessage *pLVar2;
  int *piVar3;
  string *v;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  LogMessage LStack_38;
  char *local_28;
  
  v = (string *)contents._M_str;
  __s = fopen((v->_M_dataplus)._M_p,"wb");
  if (__s == (FILE *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/file.cc"
               ,0x67,"file != nullptr");
    str._M_str = "fopen(";
    str._M_len = 6;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_38,str)
    ;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_38,v);
    str_00._M_str = ", \"wb\"): ";
    str_00._M_len = 9;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar2,str_00);
    piVar3 = __errno_location();
    local_28 = strerror(*piVar3);
    absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>(pLVar2,&local_28);
  }
  else {
    v1 = (File *)fwrite((void *)contents._M_len,1,(size_t)this,__s);
    if (v1 == this) {
      iVar1 = fclose(__s);
      if (iVar1 == 0) {
        return;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/file.cc"
                 ,0x6c,"fclose(file) == 0");
      str_03._M_str = "fclose(";
      str_03._M_len = 7;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&LStack_38,str_03);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_38,v);
      str_04._M_str = "): ";
      str_04._M_len = 3;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (pLVar2,str_04);
      piVar3 = __errno_location();
      local_28 = strerror(*piVar3);
      absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>(pLVar2,&local_28);
    }
    else {
      failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                              ((unsigned_long)v1,(unsigned_long)this,
                               "fwrite(contents.data(), 1, contents.size(), file) == contents.size()"
                              );
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/file.cc"
                 ,0x6a,failure_msg);
      str_01._M_str = "fwrite(";
      str_01._M_len = 7;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&LStack_38,str_01);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_38,v);
      str_02._M_str = "): ";
      str_02._M_len = 3;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (pLVar2,str_02);
      piVar3 = __errno_location();
      local_28 = strerror(*piVar3);
      absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>(pLVar2,&local_28);
    }
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_38)
  ;
}

Assistant:

void File::WriteStringToFileOrDie(absl::string_view contents,
                                  const std::string& name) {
  FILE* file = fopen(name.c_str(), "wb");
  ABSL_CHECK(file != nullptr)
      << "fopen(" << name << ", \"wb\"): " << strerror(errno);
  ABSL_CHECK_EQ(fwrite(contents.data(), 1, contents.size(), file),
                contents.size())
      << "fwrite(" << name << "): " << strerror(errno);
  ABSL_CHECK(fclose(file) == 0)
      << "fclose(" << name << "): " << strerror(errno);
}